

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::WebSocket::pumpTo(WebSocket *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node;
  byte bVar3;
  PromiseArenaMember *pPVar4;
  void *pvVar5;
  WebSocket *in_RDX;
  PromiseArenaMember *unaff_RBP;
  PromiseNode *ptrCopy;
  Exception *e;
  TransformPromiseNodeBase *this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3802:53),_void>
  cancelPromise;
  PromiseNode *ptrCopy_1;
  NullableValue<kj::Exception> _e1576;
  OwnPromiseNode local_528;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_520;
  PromiseArenaMember *local_518;
  OwnPromiseNode local_510;
  OwnPromiseNode local_508;
  PromiseArenaMember *local_500;
  byte local_4f8 [8];
  PromiseArenaMember *local_4f0;
  undefined1 local_360;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  
  (*in_RDX->_vptr_WebSocket[8])(local_4f8);
  pPVar4 = local_4f0;
  bVar3 = local_4f8[0];
  local_518 = unaff_RBP;
  if (local_4f8[0] == 1) {
    local_4f0 = (PromiseArenaMember *)0x0;
    local_518 = pPVar4;
  }
  if (local_4f8[0] == 0) {
    this->_vptr_WebSocket = (_func_int **)0x0;
    local_510.ptr = (PromiseNode *)this;
    (*in_RDX->_vptr_WebSocket[5])(&local_528);
    OVar2.ptr = local_528.ptr;
    pPVar1 = ((local_528.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_528.ptr - (long)pPVar1) < 0x28) {
      pvVar5 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_528,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3802:53)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_0063f178;
      *(WebSocket **)((long)pvVar5 + 0x3f8) = other;
      *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
    }
    else {
      ((local_528.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&local_528.ptr[-3].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_528,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3802:53)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0063f178;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)other;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_1c8._0_8_ = &DAT_004a8171;
    local_1c8._8_8_ = &DAT_004a81d0;
    local_1b8 = &DAT_4c0000058b;
    local_508.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_500,&local_508,(SourceLocation *)local_1c8);
    OVar2.ptr = local_508.ptr;
    local_520.ptr = (PromiseNode *)local_500;
    if ((TransformPromiseNodeBase *)local_508.ptr != (TransformPromiseNodeBase *)0x0) {
      local_508.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    this = (WebSocket *)local_510.ptr;
    OVar2.ptr = local_528.ptr;
    if (&(local_528.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_528.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    pumpWebSocketLoop((kj *)&local_508,other,in_RDX);
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    local_1c8._8_8_ = "operator()";
    local_1b8._0_4_ = 0xedf;
    local_1b8._4_4_ = 0xe;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              ((PromiseDisposer *)&local_500,&local_508,&local_520,(SourceLocation *)local_1c8);
    OVar2.ptr = local_508.ptr;
    if ((TransformPromiseNodeBase *)local_508.ptr != (TransformPromiseNodeBase *)0x0) {
      local_508.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    node.ptr = local_520.ptr;
    if (&(local_520.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_520.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    (((PromiseNode *)this)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)local_500;
    local_360 = 0;
    local_4f8[0] = 0;
  }
  else {
    this->_vptr_WebSocket = (_func_int **)local_518;
    local_518 = (PromiseArenaMember *)0x0;
  }
  if ((bVar3 & local_518 != (PromiseArenaMember *)0x0) == 1) {
    kj::_::PromiseDisposer::dispose(local_518);
  }
  return (Promise<void>)(PromiseNode *)this;
}

Assistant:

kj::Promise<void> WebSocket::pumpTo(WebSocket& other) {
  KJ_IF_SOME(p, other.tryPumpFrom(*this)) {
    // Yay, optimized pump!
    return kj::mv(p);
  } else {
    // Fall back to default implementation.
    return kj::evalNow([&]() {
      auto cancelPromise = other.whenAborted().then([this]() -> kj::Promise<void> {
        this->abort();
        return KJ_EXCEPTION(DISCONNECTED,
            "destination of WebSocket pump disconnected prematurely");
      });
      return pumpWebSocketLoop(*this, other).exclusiveJoin(kj::mv(cancelPromise));
    });
  }
}